

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

_Bool is_a_vowel(wchar_t ch)

{
  uint uVar1;
  __int32_t **pp_Var2;
  
  pp_Var2 = __ctype_tolower_loc();
  uVar1 = (*pp_Var2)[(uint)(ch & 0xff)] - 0x61U >> 1;
  return (_Bool)((byte)(0x495 >> ((byte)uVar1 & 0x1f)) &
                (uVar1 | (uint)(((*pp_Var2)[(uint)(ch & 0xff)] - 0x61U & 1) != 0) << 0x1f) < 0xb);
}

Assistant:

bool is_a_vowel(int ch)
{
	switch (tolower((unsigned char) ch))
	{
		case 'a':
		case 'e':
		case 'i':
		case 'o':
		case 'u':
		{
			return (true);
		}
	}

	return (false);
}